

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTimestepper.cpp
# Opt level: O2

void __thiscall
chrono::ChTimestepperNewmark::SetGammaBeta(ChTimestepperNewmark *this,double mgamma,double mbeta)

{
  undefined1 auVar1 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar2 [64];
  undefined8 in_XMM1_Qb;
  undefined1 auVar3 [16];
  
  auVar2._8_56_ = in_register_00001208;
  auVar2._0_8_ = mgamma;
  auVar3._8_8_ = 0x3ff0000000000000;
  auVar3._0_8_ = 0x3ff0000000000000;
  auVar1._8_8_ = in_XMM1_Qb;
  auVar1._0_8_ = mbeta;
  auVar1 = vunpcklpd_avx(auVar2._0_16_,auVar1);
  auVar1 = vmaxpd_avx(ZEXT816(0x3fe0000000000000),auVar1);
  auVar1 = vminpd_avx(auVar3,auVar1);
  this->gamma = (double)auVar1._0_8_;
  this->beta = (double)auVar1._8_8_;
  return;
}

Assistant:

void ChTimestepperNewmark::SetGammaBeta(double mgamma, double mbeta) {
    gamma = mgamma;
    if (gamma < 0.5)
        gamma = 0.5;
    if (gamma > 1)
        gamma = 1;
    beta = mbeta;
    if (beta < 0)
        beta = 0;
    if (beta > 1)
        beta = 1;
}